

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

void __thiscall Json::Value::Value(Value *this,Value *other)

{
  char *pcVar1;
  void *pvVar2;
  undefined8 *puVar3;
  long *plVar4;
  uint uVar5;
  long *in_RSI;
  long *in_RDI;
  CommentInfo *otherComment;
  int comment;
  char *str;
  uint len;
  size_t in_stack_00000150;
  undefined4 in_stack_00000158;
  uint in_stack_0000015c;
  CommentInfo *in_stack_00000160;
  map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  *in_stack_ffffffffffffff68;
  map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  CommentInfo *local_58;
  int local_30;
  
  *(char *)(in_RDI + 1) = (char)in_RSI[1];
  *(byte *)((long)in_RDI + 9) = *(byte *)((long)in_RDI + 9) & 0xfe;
  in_RDI[2] = 0;
  in_RDI[3] = in_RSI[3];
  in_RDI[4] = in_RSI[4];
  uVar5 = (uint)(ushort)*(byte *)(in_RDI + 1);
  if (3 < *(byte *)(in_RDI + 1)) {
    if (uVar5 == 4) {
      if ((*in_RSI == 0) || ((*(ushort *)(in_RSI + 1) >> 8 & 1) == 0)) {
        *in_RDI = *in_RSI;
        *(ushort *)(in_RDI + 1) = *(ushort *)(in_RDI + 1) & 0xfeff;
      }
      else {
        decodePrefixedString
                  (SUB81((ulong)in_stack_ffffffffffffff80 >> 0x38,0),in_stack_ffffffffffffff78,
                   (uint *)in_stack_ffffffffffffff70,(char **)in_stack_ffffffffffffff68);
        pcVar1 = duplicateAndPrefixStringValue((char *)in_stack_00000160,in_stack_0000015c);
        *in_RDI = (long)pcVar1;
        *(ushort *)(in_RDI + 1) = *(ushort *)(in_RDI + 1) & 0xfeff | 0x100;
      }
      goto LAB_002ceee2;
    }
    if (uVar5 != 5) {
      if (uVar5 - 6 < 2) {
        pvVar2 = operator_new(0x30);
        std::
        map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
        ::map(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        *in_RDI = (long)pvVar2;
      }
      goto LAB_002ceee2;
    }
  }
  *in_RDI = *in_RSI;
LAB_002ceee2:
  if (in_RSI[2] != 0) {
    puVar3 = (undefined8 *)operator_new__(0x20);
    *puVar3 = 3;
    local_58 = (CommentInfo *)(puVar3 + 1);
    do {
      CommentInfo::CommentInfo(local_58);
      local_58 = local_58 + 1;
    } while (local_58 != (CommentInfo *)(puVar3 + 4));
    in_RDI[2] = (long)(puVar3 + 1);
    for (local_30 = 0; local_30 < 3; local_30 = local_30 + 1) {
      plVar4 = (long *)(in_RSI[2] + (long)local_30 * 8);
      if (*plVar4 != 0) {
        strlen((char *)*plVar4);
        CommentInfo::setComment
                  (in_stack_00000160,(char *)CONCAT44(in_stack_0000015c,in_stack_00000158),
                   in_stack_00000150);
      }
    }
  }
  return;
}

Assistant:

Value::Value(Value const& other)
    : type_(other.type_), allocated_(false)
      ,
      comments_(0), start_(other.start_), limit_(other.limit_)
{
  switch (type_) {
  case nullValue:
  case intValue:
  case uintValue:
  case realValue:
  case booleanValue:
    value_ = other.value_;
    break;
  case stringValue:
    if (other.value_.string_ && other.allocated_) {
      unsigned len;
      char const* str;
      decodePrefixedString(other.allocated_, other.value_.string_,
          &len, &str);
      value_.string_ = duplicateAndPrefixStringValue(str, len);
      allocated_ = true;
    } else {
      value_.string_ = other.value_.string_;
      allocated_ = false;
    }
    break;
  case arrayValue:
  case objectValue:
    value_.map_ = new ObjectValues(*other.value_.map_);
    break;
  default:
    JSON_ASSERT_UNREACHABLE;
  }
  if (other.comments_) {
    comments_ = new CommentInfo[numberOfCommentPlacement];
    for (int comment = 0; comment < numberOfCommentPlacement; ++comment) {
      const CommentInfo& otherComment = other.comments_[comment];
      if (otherComment.comment_)
        comments_[comment].setComment(
            otherComment.comment_, strlen(otherComment.comment_));
    }
  }
}